

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.hpp
# Opt level: O0

ClockSync * binlog::systemClockSync(void)

{
  size_t sVar1;
  uint64_t uVar2;
  ClockSync *in_RDI;
  uint64_t frequency;
  char tzName [128];
  char offset_str [6];
  int offset;
  tm now_tm;
  time_t now_tt;
  time_point now_tp;
  nanoseconds since_epoch;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffeb8;
  duration<long,_std::ratio<1L,_1000000000L>_> *this;
  ClockSync *__t;
  allocator local_109;
  duration<long,_std::ratio<1L,_1000000000L>_> local_108;
  undefined8 local_100;
  char local_f8 [142];
  char local_6a;
  char local_69;
  char local_68;
  char local_67;
  char local_66;
  int local_64;
  tm local_60;
  time_t local_28;
  duration local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  duration<long,_std::ratio<1L,_1000000000L>_> local_10 [2];
  
  __t = in_RDI;
  local_10[0].__r = (rep)clockSinceEpoch();
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_fffffffffffffeb8);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_18,&local_20);
  local_28 = std::chrono::_V2::system_clock::to_time_t((time_point *)__t);
  memset(&local_60,0,0x38);
  localtime_r(&local_28,&local_60);
  local_64 = 0;
  memset(&local_6a,0,6);
  sVar1 = strftime(&local_6a,6,"%z",&local_60);
  if (sVar1 == 5) {
    local_64 = 1;
    if (local_6a == '-') {
      local_64 = -1;
    }
    local_64 = (((local_69 + -0x30) * 10 + local_68 + -0x30) * 0xe10 +
               ((local_67 + -0x30) * 10 + local_66 + -0x30) * 0x3c) * local_64;
  }
  memset(local_f8,0,0x80);
  sVar1 = strftime(local_f8,0x80,"%Z",&local_60);
  if (sVar1 == 0) {
    local_f8[0] = '\0';
  }
  local_100 = 1000000000;
  this = local_10;
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(this);
  __t->clockValue = uVar2;
  __t->clockFrequency = 1000000000;
  local_108.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (this);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_108);
  __t->nsSinceEpoch = uVar2;
  __t->tzOffset = local_64;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&__t->tzName,local_f8,&local_109);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  return in_RDI;
}

Assistant:

inline ClockSync systemClockSync()
{
  using Clock = std::chrono::system_clock;

  const auto since_epoch = clockSinceEpoch();
  const auto now_tp = Clock::time_point(std::chrono::duration_cast<Clock::duration>(since_epoch));
  const std::time_t now_tt = Clock::to_time_t(now_tp);

  std::tm now_tm{};
  #ifdef _WIN32
    localtime_s(&now_tm, &now_tt);
  #else // assume POSIX
    localtime_r(&now_tt, &now_tm);
  #endif

  // TODO(benedek) platform: access TZ related tm fields, where available
  int offset = 0;
  char offset_str[6] = {0};
  if (strftime(offset_str, sizeof(offset_str), "%z", &now_tm) == 5)
  {
    // offset_str is +HHMM or -HHMM
    offset = (
      ((offset_str[1]-'0') * 10 + (offset_str[2]-'0')) * 3600 +
      ((offset_str[3]-'0') * 10 + (offset_str[4]-'0')) * 60
    ) * ((offset_str[0] == '-') ? -1 : 1);
  }

  char tzName[128] = {0};
  if (strftime(tzName, sizeof(tzName), "%Z", &now_tm) == 0)
  {
    tzName[0] = 0;
  }

  using Period = decltype(since_epoch)::period;
  static_assert(Period::num == 1, "Clock measures integer fractions of a second");
  const uint64_t frequency = std::uint64_t(Period::den);

  return ClockSync{
    std::uint64_t(since_epoch.count()),
    frequency,
    std::uint64_t(std::chrono::duration_cast<std::chrono::nanoseconds>(since_epoch).count()),
    offset,
    tzName
  };
}